

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

uint __thiscall ON_SubDFace::MarkedVertexCount(ON_SubDFace *this)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  uint uVar4;
  unsigned_short fei;
  ushort uVar5;
  ON_SubDEdgePtr *pOVar6;
  
  pOVar6 = this->m_edge4;
  uVar5 = 0;
  uVar4 = 0;
  while ((uVar5 < this->m_edge_count &&
         ((uVar5 != 4 || (pOVar6 = this->m_edgex, pOVar6 != (ON_SubDEdgePtr *)0x0))))) {
    uVar3 = pOVar6->m_ptr & 0xfffffffffffffff8;
    if ((uVar3 != 0) &&
       (lVar1 = *(long *)(uVar3 + 0x80 + (ulong)((uint)pOVar6->m_ptr & 1) * 8), lVar1 != 0)) {
      bVar2 = ON_ComponentStatus::RuntimeMark((ON_ComponentStatus *)(lVar1 + 0x10));
      uVar4 = uVar4 + bVar2;
    }
    uVar5 = uVar5 + 1;
    pOVar6 = pOVar6 + 1;
  }
  return uVar4;
}

Assistant:

unsigned int ON_SubDFace::MarkedVertexCount() const
{
  unsigned int marked_vertex_count = 0;
  const ON_SubDEdgePtr* eptr = m_edge4;
  for (unsigned short fei = 0; fei < m_edge_count; ++fei, ++ eptr)
  {
    if (4 == fei)
    {
      eptr = m_edgex;
      if (nullptr == eptr)
        break;
    }
    const ON_SubDVertex* v = eptr->RelativeVertex(0);
    if (nullptr != v && v->m_status.RuntimeMark())
      ++marked_vertex_count;
  }
  return marked_vertex_count;
}